

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fmcalc.cpp
# Opt level: O3

void __thiscall
fmcalc::parse_policytc(fmcalc *this,vector<fm_policyTC,_std::allocator<fm_policyTC>_> *p)

{
  pointer *ppfVar1;
  iterator iVar2;
  long lVar3;
  int iVar4;
  long *plVar5;
  FILE *__stream;
  size_t sVar6;
  iterator iVar7;
  ulong uVar8;
  undefined8 extraout_RAX;
  pointer pvVar9;
  int iVar10;
  int iVar11;
  int iVar12;
  pointer pfVar13;
  pointer pfVar14;
  bool bVar15;
  layer_agg l_1;
  layer_agg l;
  string file;
  fm_policyTC f;
  set<layer_agg,_std::less<layer_agg>,_std::allocator<layer_agg>_> la;
  int local_d4;
  key_type local_c0;
  fm_policyTC local_b8;
  fmcalc *local_a8;
  undefined1 local_a0 [36];
  int iStack_7c;
  undefined8 uStack_78;
  undefined1 local_70 [16];
  undefined1 local_60 [8];
  undefined1 local_58 [16];
  _Base_ptr p_Stack_48;
  _Base_ptr local_40;
  size_t local_38;
  
  local_a0._0_8_ = local_a0 + 0x10;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_a0,"input/fm_policytc.bin","");
  local_a8 = this;
  if ((this->inputpath_)._M_string_length != 0) {
    std::__cxx11::string::substr((ulong)(local_a0 + 0x20),(ulong)local_a0);
    plVar5 = (long *)std::__cxx11::string::replace
                               ((ulong)(local_a0 + 0x20),0,(char *)0x0,
                                (ulong)(local_a8->inputpath_)._M_dataplus._M_p);
    pvVar9 = (pointer)(plVar5 + 2);
    if ((pointer)*plVar5 == pvVar9) {
      local_58._8_8_ =
           (pvVar9->
           super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
           )._M_impl.super__Vector_impl_data._M_start;
      p_Stack_48 = (_Base_ptr)plVar5[3];
      local_60 = (undefined1  [8])(local_58 + 8);
    }
    else {
      local_58._8_8_ =
           (pvVar9->
           super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
           )._M_impl.super__Vector_impl_data._M_start;
      local_60 = (undefined1  [8])*plVar5;
    }
    local_58._0_8_ = plVar5[1];
    *plVar5 = (long)pvVar9;
    plVar5[1] = 0;
    *(undefined1 *)(plVar5 + 2) = 0;
    std::__cxx11::string::operator=((string *)local_a0,(string *)local_60);
    if (local_60 != (undefined1  [8])(local_58 + 8)) {
      operator_delete((void *)local_60);
    }
    if ((undefined1 *)CONCAT44(iStack_7c,local_a0._32_4_) != local_70) {
      operator_delete((undefined1 *)CONCAT44(iStack_7c,local_a0._32_4_));
    }
  }
  __stream = fopen((char *)local_a0._0_8_,"rb");
  if (__stream != (FILE *)0x0) {
    sVar6 = fread(local_a0 + 0x20,0x10,1,__stream);
    iVar11 = 0;
    if (sVar6 != 0) {
      do {
        iVar2._M_current =
             (p->super__Vector_base<fm_policyTC,_std::allocator<fm_policyTC>_>)._M_impl.
             super__Vector_impl_data._M_finish;
        if (iVar2._M_current ==
            (p->super__Vector_base<fm_policyTC,_std::allocator<fm_policyTC>_>)._M_impl.
            super__Vector_impl_data._M_end_of_storage) {
          std::vector<fm_policyTC,std::allocator<fm_policyTC>>::
          _M_realloc_insert<fm_policyTC_const&>
                    ((vector<fm_policyTC,std::allocator<fm_policyTC>> *)p,iVar2,
                     (fm_policyTC *)(local_a0 + 0x20));
        }
        else {
          (iVar2._M_current)->level_id = local_a0._32_4_;
          (iVar2._M_current)->agg_id = iStack_7c;
          *(undefined8 *)&(iVar2._M_current)->layer_id = uStack_78;
          ppfVar1 = &(p->super__Vector_base<fm_policyTC,_std::allocator<fm_policyTC>_>)._M_impl.
                     super__Vector_impl_data._M_finish;
          *ppfVar1 = *ppfVar1 + 1;
        }
        if (iVar11 < (int)local_a0._32_4_) {
          iVar11 = local_a0._32_4_;
        }
        sVar6 = fread((fm_policyTC *)(local_a0 + 0x20),0x10,1,__stream);
      } while (sVar6 != 0);
    }
    fclose(__stream);
    p_Stack_48 = (_Base_ptr)local_58;
    local_58._0_8_ = local_58._0_8_ & 0xffffffff00000000;
    local_58._8_8_ = (_Base_ptr)0x0;
    iVar4 = 0;
    local_38 = 0;
    pfVar13 = (p->super__Vector_base<fm_policyTC,_std::allocator<fm_policyTC>_>)._M_impl.
              super__Vector_impl_data._M_start;
    pfVar14 = (p->super__Vector_base<fm_policyTC,_std::allocator<fm_policyTC>_>)._M_impl.
              super__Vector_impl_data._M_finish;
    local_40 = p_Stack_48;
    if (pfVar13 != pfVar14) {
      local_d4 = 0;
      do {
        if (pfVar13->level_id == iVar11) {
          iVar12 = pfVar13->agg_id;
          iVar10 = pfVar13->layer_id;
          local_b8.level_id = iVar10;
          local_b8.agg_id = iVar12;
          std::
          _Rb_tree<layer_agg,layer_agg,std::_Identity<layer_agg>,std::less<layer_agg>,std::allocator<layer_agg>>
          ::_M_insert_unique<layer_agg_const&>
                    ((_Rb_tree<layer_agg,layer_agg,std::_Identity<layer_agg>,std::less<layer_agg>,std::allocator<layer_agg>>
                      *)local_60,(layer_agg *)&local_b8);
          if (iVar4 < iVar10) {
            iVar4 = iVar10;
          }
          if (local_d4 < iVar12) {
            local_d4 = iVar12;
          }
          pfVar14 = (p->super__Vector_base<fm_policyTC,_std::allocator<fm_policyTC>_>)._M_impl.
                    super__Vector_impl_data._M_finish;
        }
        pfVar13 = pfVar13 + 1;
      } while (pfVar13 != pfVar14);
      if (0 < iVar4) {
        iVar12 = 1;
        do {
          if (0 < local_d4) {
            iVar10 = 1;
            do {
              local_c0.layer_id = iVar12;
              local_c0.agg_id = iVar10;
              iVar7 = std::
                      _Rb_tree<layer_agg,_layer_agg,_std::_Identity<layer_agg>,_std::less<layer_agg>,_std::allocator<layer_agg>_>
                      ::find((_Rb_tree<layer_agg,_layer_agg,_std::_Identity<layer_agg>,_std::less<layer_agg>,_std::allocator<layer_agg>_>
                              *)local_60,&local_c0);
              if (iVar7._M_node == (_Base_ptr)local_58) {
                local_b8.agg_id = local_c0.agg_id;
                local_b8.layer_id = local_c0.layer_id;
                local_b8.profile_id = local_a8->noop_profile_id;
                iVar2._M_current =
                     (p->super__Vector_base<fm_policyTC,_std::allocator<fm_policyTC>_>)._M_impl.
                     super__Vector_impl_data._M_finish;
                local_b8.level_id = iVar11;
                if (iVar2._M_current ==
                    (p->super__Vector_base<fm_policyTC,_std::allocator<fm_policyTC>_>)._M_impl.
                    super__Vector_impl_data._M_end_of_storage) {
                  std::vector<fm_policyTC,std::allocator<fm_policyTC>>::
                  _M_realloc_insert<fm_policyTC_const&>
                            ((vector<fm_policyTC,std::allocator<fm_policyTC>> *)p,iVar2,&local_b8);
                }
                else {
                  (iVar2._M_current)->level_id = iVar11;
                  (iVar2._M_current)->agg_id = local_c0.agg_id;
                  (iVar2._M_current)->layer_id = local_c0.layer_id;
                  (iVar2._M_current)->profile_id = local_b8.profile_id;
                  ppfVar1 = &(p->super__Vector_base<fm_policyTC,_std::allocator<fm_policyTC>_>).
                             _M_impl.super__Vector_impl_data._M_finish;
                  *ppfVar1 = *ppfVar1 + 1;
                }
              }
              bVar15 = iVar10 != local_d4;
              iVar10 = iVar10 + 1;
            } while (bVar15);
          }
          bVar15 = iVar12 != iVar4;
          iVar12 = iVar12 + 1;
        } while (bVar15);
        pfVar14 = (p->super__Vector_base<fm_policyTC,_std::allocator<fm_policyTC>_>)._M_impl.
                  super__Vector_impl_data._M_finish;
      }
    }
    pfVar13 = (p->super__Vector_base<fm_policyTC,_std::allocator<fm_policyTC>_>)._M_impl.
              super__Vector_impl_data._M_start;
    if (pfVar13 != pfVar14) {
      uVar8 = (long)pfVar14 - (long)pfVar13 >> 4;
      lVar3 = 0x3f;
      if (uVar8 != 0) {
        for (; uVar8 >> lVar3 == 0; lVar3 = lVar3 + -1) {
        }
      }
      std::
      __introsort_loop<__gnu_cxx::__normal_iterator<fm_policyTC*,std::vector<fm_policyTC,std::allocator<fm_policyTC>>>,long,__gnu_cxx::__ops::_Iter_less_iter>
                (pfVar13,pfVar14,((uint)lVar3 ^ 0x3f) * 2 ^ 0x7e);
      std::
      __final_insertion_sort<__gnu_cxx::__normal_iterator<fm_policyTC*,std::vector<fm_policyTC,std::allocator<fm_policyTC>>>,__gnu_cxx::__ops::_Iter_less_iter>
                (pfVar13,pfVar14);
    }
    std::
    _Rb_tree<layer_agg,_layer_agg,_std::_Identity<layer_agg>,_std::less<layer_agg>,_std::allocator<layer_agg>_>
    ::~_Rb_tree((_Rb_tree<layer_agg,_layer_agg,_std::_Identity<layer_agg>,_std::less<layer_agg>,_std::allocator<layer_agg>_>
                 *)local_60);
    if ((undefined1 *)local_a0._0_8_ != local_a0 + 0x10) {
      operator_delete((void *)local_a0._0_8_);
    }
    return;
  }
  parse_policytc((fmcalc *)local_a0);
  if ((undefined1 *)CONCAT44(iStack_7c,local_a0._32_4_) != local_70) {
    operator_delete((undefined1 *)CONCAT44(iStack_7c,local_a0._32_4_));
  }
  if ((undefined1 *)local_a0._0_8_ != local_a0 + 0x10) {
    operator_delete((void *)local_a0._0_8_);
  }
  _Unwind_Resume(extraout_RAX);
}

Assistant:

void fmcalc::parse_policytc(std::vector< fm_policyTC> &p)
{
	FILE* fin = NULL;
	std::string file = FMPOLICYTC_FILE;
	if (inputpath_.length() > 0) {
		file = inputpath_ + file.substr(5);
	}
	fin = fopen(file.c_str(), "rb");

	if (fin == NULL) {
		fprintf(stderr, "FATAL: %s: cannot open %s\n", __func__, file.c_str());
		exit(EXIT_FAILURE);
	}
	fm_policyTC f;
	
	int max_layer_id = 0;
	int max_level_id = 0;
	size_t i = fread(&f, sizeof(f), 1, fin);
	while (i != 0) {
		p.push_back(f);		
		if (f.level_id > max_level_id) max_level_id = f.level_id;			
		i = fread(&f, sizeof(f), 1, fin);
	}
	fclose(fin);
	std::set<layer_agg> la;
	auto iter = p.begin();
	int max_agg_id = 0;

	while (iter != p.end()) {
		if (iter->level_id == max_level_id) {
			if (iter->agg_id > max_agg_id) max_agg_id = iter->agg_id;
			if (iter->layer_id > max_layer_id) max_layer_id = iter->layer_id;
			layer_agg l;
			l.agg_id = iter->agg_id;
			l.layer_id = iter->layer_id;
			la.insert(l);
		}
		iter++;
	}


	for (int i = 1;i <= max_layer_id;i++) {
		for (int j = 1;j <= max_agg_id;j++) {
			layer_agg l;
			l.layer_id = i;
			l.agg_id = j;
			auto iter = la.find(l);
			if (iter == la.end()) {
				fm_policyTC f;
				f.agg_id = l.agg_id;
				f.layer_id = l.layer_id;
				f.level_id = max_level_id;
				f.profile_id = noop_profile_id;
				p.push_back(f);
			}
		}
	}


	std::sort(p.begin(), p.end());

}